

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

Descriptor *
cfd::core::Descriptor::CreateDescriptor
          (Descriptor *__return_storage_ptr__,
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *type_list,
          vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
          *key_info_list,uint32_t require_num,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DescriptorScriptType DVar3;
  pointer pDVar4;
  bool bVar5;
  pointer pDVar6;
  Descriptor *pDVar7;
  char cVar8;
  char cVar9;
  long lVar10;
  undefined8 *puVar11;
  long *plVar12;
  CfdException *pCVar13;
  uint32_t uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long *plVar16;
  pointer this;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  string output_descriptor;
  string key_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> types;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  string local_110;
  uint32_t local_ec;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  pointer local_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  uint local_98;
  undefined4 uStack_94;
  ulong local_90 [2];
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *local_60;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> local_58
  ;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_40;
  Descriptor *local_38;
  
  local_ec = require_num;
  local_60 = key_info_list;
  if ((type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_150._0_8_ = "cfdcore_descriptor.cpp";
    local_150._8_4_ = 0x83d;
    local_140._M_allocated_capacity = 0x612b59;
    logger::log<>((CfdSourceLocation *)local_150,kCfdLogLevelWarning,"Failed to type list.");
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150._0_8_ = &local_140;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"Failed to type list. list is empty.","");
    CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_150);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_150._0_8_ = &local_140;
  local_150._8_8_ = 0;
  local_140._M_allocated_capacity = local_140._M_allocated_capacity & 0xffffffffffffff00;
  local_40 = network_parameters;
  local_38 = __return_storage_ptr__;
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector(&local_58,type_list);
  if (local_58.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_58.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar2 = &local_110.field_2;
    do {
      local_130 = &local_120;
      DVar3 = local_58.
              super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
      local_128 = 0;
      local_120 = 0;
      local_c8 = local_58.
                 super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_150._8_8_ == 0) {
        pDVar4 = (local_60->
                 super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (this = (local_60->
                    super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start; this != pDVar4; this = this + 1) {
          if (local_128 == 0) {
            DescriptorKeyInfo::ToString_abi_cxx11_((string *)local_170,this);
            ::std::__cxx11::string::operator=((string *)&local_130,(string *)local_170);
            uVar17 = local_160._M_allocated_capacity;
            _Var18._M_p = (pointer)local_170._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) goto LAB_00337713;
          }
          else {
            DescriptorKeyInfo::ToString_abi_cxx11_(&local_110,this);
            plVar12 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_110,0,(char *)0x0,0x612b57);
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar15) {
              local_160._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_160._8_8_ = plVar12[3];
              local_170._0_8_ = &local_160;
            }
            else {
              local_160._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_170._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar12;
            }
            local_170._8_8_ = plVar12[1];
            *plVar12 = (long)paVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_130,local_170._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) {
              operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
            }
            uVar17 = local_110.field_2._M_allocated_capacity;
            _Var18._M_p = local_110._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != paVar2) {
LAB_00337713:
              operator_delete(_Var18._M_p,uVar17 + 1);
            }
          }
        }
      }
      local_c8 = local_c8 + -1;
      lVar10 = 0;
      do {
        if (DVar3 == *(DescriptorScriptType *)((long)&DAT_008a60f0 + lVar10)) {
          plVar12 = (long *)((long)&kDescriptorNodeScriptTable + lVar10);
          goto LAB_003375a4;
        }
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0x1b8);
      plVar12 = (long *)0x0;
LAB_003375a4:
      if (DVar3 - kDescriptorScriptPk < 6) {
        if (local_150._8_8_ != 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x861;
          local_160._M_allocated_capacity = 0x612b59;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "key hash type is bottom only.");
          pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key hash type is bottom only."
                     ,"");
          CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_128 == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x867;
          local_160._M_allocated_capacity = 0x612b59;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"key list is empty");
          pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key list is empty.","");
          CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (plVar12 == (long *)0x0) {
LAB_00337d83:
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x88b;
          local_160._M_allocated_capacity = 0x612b59;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"Failed to script type.")
          ;
          pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to script type. this type is unsupported.","");
          CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if ((*(char *)((long)plVar12 + 0x26) == '\0') &&
           (1 < (ulong)(((long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) *
                       -0x34115b1e5f75270d))) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x86e;
          local_160._M_allocated_capacity = 0x612b59;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "multiple key is multisig only.");
          pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to createDescriptor. multiple key is multisig only.","");
          CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
        }
LAB_0033776a:
        if (*(char *)((long)plVar12 + 0x26) != '\x01') {
          local_e8 = &local_d8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,*plVar12,plVar12[1] + *plVar12);
          ::std::__cxx11::string::append((char *)&local_e8);
          plVar12 = (long *)::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar15) {
            local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_110.field_2._8_8_ = plVar12[3];
            local_110._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_110._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_110._M_string_length = plVar12[1];
          *plVar12 = (long)paVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
          goto LAB_003378af;
        }
        local_c0 = local_b0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,*plVar12,plVar12[1] + *plVar12);
        ::std::__cxx11::string::append((char *)&local_c0);
        cVar9 = '\x01';
        if (9 < local_ec) {
          uVar14 = local_ec;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar14 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_003379d3;
            }
            if (uVar14 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_003379d3;
            }
            if (uVar14 < 10000) goto LAB_003379d3;
            bVar5 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar5);
          cVar9 = cVar9 + '\x01';
        }
LAB_003379d3:
        local_a0 = local_90;
        ::std::__cxx11::string::_M_construct((ulong)&local_a0,cVar9);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,local_98,local_ec);
        uVar19 = 0xf;
        if (local_c0 != local_b0) {
          uVar19 = local_b0[0];
        }
        uVar1 = CONCAT44(uStack_94,local_98) + local_b8;
        if (uVar19 < uVar1) {
          uVar19 = 0xf;
          if (local_a0 != local_90) {
            uVar19 = local_90[0];
          }
          if (uVar19 < uVar1) goto LAB_00337a71;
          puVar11 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_00337a71:
          puVar11 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
        }
        plVar12 = puVar11 + 2;
        if ((long *)*puVar11 == plVar12) {
          local_70 = *plVar12;
          uStack_68 = puVar11[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar12;
          local_80 = (long *)*puVar11;
        }
        local_78 = puVar11[1];
        *puVar11 = plVar12;
        puVar11[1] = 0;
        *(undefined1 *)plVar12 = 0;
        plVar12 = (long *)::std::__cxx11::string::append((char *)&local_80);
        plVar16 = plVar12 + 2;
        if ((long *)*plVar12 == plVar16) {
          local_d8 = *plVar16;
          lStack_d0 = plVar12[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar16;
          local_e8 = (long *)*plVar12;
        }
        local_e0 = plVar12[1];
        *plVar12 = (long)plVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        puVar11 = (undefined8 *)
                  ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar15) {
          local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_110.field_2._8_8_ = puVar11[3];
          local_110._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_110._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_110._M_string_length = puVar11[1];
        *puVar11 = paVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar15) {
          local_160._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_160._8_8_ = puVar11[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_170._8_8_ = puVar11[1];
        *puVar11 = paVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        pDVar6 = local_c8;
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        local_58.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar6;
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
      }
      else {
        if (1 < DVar3 - kDescriptorScriptSh) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x883;
          local_160._M_allocated_capacity = 0x612b59;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"Failed to script type.")
          ;
          pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to script type. this type is unsupported.","");
          CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_150._8_8_ == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x877;
          local_160._M_allocated_capacity = 0x612b59;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "Failed to script hash type.");
          pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to script hash type. this type is unsupported of key.","");
          CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (plVar12 == (long *)0x0) goto LAB_00337d83;
        if (local_128 != 0) goto LAB_0033776a;
        local_e8 = &local_d8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,*plVar12,plVar12[1] + *plVar12);
        ::std::__cxx11::string::append((char *)&local_e8);
        puVar11 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_e8,local_150._0_8_)
        ;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar15) {
          local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_110.field_2._8_8_ = puVar11[3];
          local_110._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_110._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_110._M_string_length = puVar11[1];
        *puVar11 = paVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
LAB_003378af:
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar15) {
          local_160._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_160._8_8_ = puVar11[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_170._8_8_ = puVar11[1];
        *puVar11 = paVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        local_58.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
          local_58.
          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        }
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
      }
    } while (local_58.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_58.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar7 = local_38;
  Parse(local_38,(string *)local_150,local_40,kMainnet);
  if (local_58.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,local_140._M_allocated_capacity + 1);
  }
  return pDVar7;
}

Assistant:

Descriptor Descriptor::CreateDescriptor(
    const std::vector<DescriptorScriptType>& type_list,
    const std::vector<DescriptorKeyInfo>& key_info_list, uint32_t require_num,
    const std::vector<AddressFormatData>* network_parameters) {
  if (type_list.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to type list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to type list. list is empty.");
  }
  std::string output_descriptor;
  std::vector<DescriptorScriptType> types(type_list);
  for (auto ite = types.rbegin(); ite != types.rend(); ++ite) {
    DescriptorScriptType type = *ite;

    std::string key_text;
    if (output_descriptor.empty() && (!key_info_list.empty())) {
      for (const auto& key_info : key_info_list) {
        if (key_text.empty()) {
          key_text = key_info.ToString();
        } else {
          key_text += "," + key_info.ToString();
        }
      }
    }

    const DescriptorNodeScriptData* p_data = nullptr;
    for (const auto& node_data : kDescriptorNodeScriptTable) {
      if (type == node_data.type) {
        p_data = &node_data;
        break;
      }
    }
    switch (type) {
      case DescriptorScriptType::kDescriptorScriptPk:
      case DescriptorScriptType::kDescriptorScriptPkh:
      case DescriptorScriptType::kDescriptorScriptWpkh:
      case DescriptorScriptType::kDescriptorScriptCombo:
      case DescriptorScriptType::kDescriptorScriptMulti:
      case DescriptorScriptType::kDescriptorScriptSortedMulti:
        if (!output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "key hash type is bottom only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key hash type is bottom only.");
        }
        if (key_text.empty()) {
          warn(CFD_LOG_SOURCE, "key list is empty");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key list is empty.");
        }
        if ((p_data != nullptr) && (!p_data->multisig) &&
            (key_info_list.size() > 1)) {
          warn(CFD_LOG_SOURCE, "multiple key is multisig only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. multiple key is multisig only.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptSh:
      case DescriptorScriptType::kDescriptorScriptWsh:
        if (output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "Failed to script hash type.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to script hash type. this type is unsupported of key.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptTaproot:
        // fall-through: unsupported yet.
      case DescriptorScriptType::kDescriptorScriptNull:
      case DescriptorScriptType::kDescriptorScriptAddr:
      case DescriptorScriptType::kDescriptorScriptRaw:
      default:
        warn(CFD_LOG_SOURCE, "Failed to script type.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to script type. this type is unsupported.");
        break;
    }

    if (p_data == nullptr) {
      warn(CFD_LOG_SOURCE, "Failed to script type.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to script type. this type is unsupported.");
    } else if (key_text.empty()) {
      output_descriptor = p_data->name + "(" + output_descriptor + ")";
    } else if (p_data->multisig) {
      output_descriptor = p_data->name + "(" + std::to_string(require_num) +
                          "," + key_text + ")";
    } else {
      output_descriptor = p_data->name + "(" + key_text + ")";
    }
  }

  // Check descriptor script format.
  return Parse(output_descriptor, network_parameters);
}